

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void internal_counters_lda_next
               (xc_dimensions *dim,int offset,double **rho,double **zk,double **vrho,double **v2rho2
               ,double **v3rho3,double **v4rho4)

{
  long lVar1;
  
  lVar1 = (long)offset;
  if (*rho != (double *)0x0) {
    *rho = *rho + dim->rho + lVar1;
  }
  if (*zk != (double *)0x0) {
    *zk = *zk + dim->zk + lVar1;
  }
  if (*vrho != (double *)0x0) {
    *vrho = *vrho + dim->vrho + lVar1;
  }
  if (*v2rho2 != (double *)0x0) {
    *v2rho2 = *v2rho2 + dim->v2rho2 + lVar1;
  }
  return;
}

Assistant:

GPU_FUNCTION void
internal_counters_lda_next
  (const xc_dimensions *dim, int offset, const double **rho,
   double **zk LDA_OUT_PARAMS_NO_EXC(XC_COMMA double **, ))
{
  if(*rho != NULL)    *rho    += dim->rho    + offset;
  if(*zk != NULL)     *zk     += dim->zk     + offset;
#ifndef XC_DONT_COMPILE_VXC
  if(*vrho != NULL)   *vrho   += dim->vrho   + offset;
#ifndef XC_DONT_COMPILE_FXC
  if(*v2rho2 != NULL) *v2rho2 += dim->v2rho2 + offset;
#ifndef XC_DONT_COMPILE_KXC
  if(*v3rho3 != NULL) *v3rho3 += dim->v3rho3 + offset;
#ifndef XC_DONT_COMPILE_LXC
  if(*v4rho4 != NULL) *v4rho4 += dim->v4rho4 + offset;
#endif
#endif
#endif
#endif
}